

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void __thiscall
MutableS2ShapeIndex::UpdateEdges
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker,EdgeAllocator *alloc,bool disjoint_from_index)

{
  undefined8 *puVar1;
  double u;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  CellRelation CVar5;
  long lVar6;
  long lVar7;
  R2Rect *pRVar8;
  ClippedEdge *edge;
  ClippedEdge *pCVar9;
  uint uVar10;
  int i;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *child_edges_00;
  bool bVar11;
  int pos;
  ulong uVar12;
  bool bVar13;
  R1Interval *middle;
  const_iterator cVar14;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  child_edges [2] [2];
  bool local_10c;
  undefined1 local_f8 [24];
  MutableS2ShapeIndex *pMStack_e0;
  iterator local_d8;
  ClippedEdge **ppCStack_d0;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  local_c8;
  undefined8 uStack_b0;
  iterator local_a8;
  ClippedEdge **ppCStack_a0;
  size_t local_98;
  S2PaddedCell local_90;
  
  if (((edges->
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (edges->
       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
       )._M_impl.super__Vector_impl_data._M_finish) &&
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
               ,0x3fe,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_f8._8_8_,
               "Check failed: !edges->empty() || !tracker->shape_ids().empty() ",0x3f);
LAB_00193134:
    abort();
  }
  if (disjoint_from_index) {
    bVar3 = MakeIndexCell(this,pcell,edges,tracker);
    if (bVar3) {
      return;
    }
    local_10c = true;
LAB_00192cf8:
    bVar3 = false;
  }
  else {
    local_f8._8_8_ = 0xffffffffffffffff;
    local_f8._16_8_ = (__pointer_type)0x0;
    local_f8._0_8_ = &PTR__IteratorBase_002bb190;
    local_d8._M_current = (ClippedEdge **)0x0;
    ppCStack_d0._0_4_ = -1;
    local_c8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = -1;
    pMStack_e0 = this;
    cVar14 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                    *)&this->cell_map_);
    local_d8._M_current = (ClippedEdge **)cVar14.node;
    local_c8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_c8.
                           super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,cVar14.position);
    ppCStack_d0 = (ClippedEdge **)CONCAT44(ppCStack_d0._4_4_,cVar14.position);
    local_f8._8_8_ = (ostream *)0xffffffffffffffff;
    local_f8._16_8_ = (__pointer_type)0x0;
    local_c8.
    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
    ._M_impl.super__Vector_impl_data._M_start = local_d8._M_current;
    CVar5 = S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
                      ((S2CellId)(pcell->id_).id_,(Iterator *)local_f8);
    if (CVar5 == INDEXED) {
      bVar3 = true;
      AbsorbIndexCell(this,pcell,(Iterator *)local_f8,edges,tracker,alloc);
    }
    else {
      if (CVar5 != DISJOINT) {
        if (CVar5 != SUBDIVIDED) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                     ,0x428,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_90.padding_,"Check failed: (SUBDIVIDED) == (r) ",0x22);
          goto LAB_00193134;
        }
        local_10c = false;
        goto LAB_00192cf8;
      }
      bVar3 = false;
    }
    bVar4 = MakeIndexCell(this,pcell,edges,tracker);
    if (bVar4) goto joined_r0x00192cdc;
    local_10c = true;
  }
  local_a8._M_current = (ClippedEdge **)0x0;
  ppCStack_a0 = (ClippedEdge **)0x0;
  local_c8.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (ClippedEdge **)0x0;
  uStack_b0 = 0;
  local_c8.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge **)0x0;
  local_d8._M_current = (ClippedEdge **)0x0;
  ppCStack_d0 = (ClippedEdge **)0x0;
  local_f8._16_8_ = (__pointer_type)0x0;
  pMStack_e0 = (MutableS2ShapeIndex *)0x0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (ostream *)0x0;
  uVar10 = (uint)((ulong)((long)(edges->
                                super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(edges->
                               super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 3);
  lVar7 = 0;
  bVar4 = true;
  do {
    bVar11 = bVar4;
    lVar6 = lVar7 * 0x30;
    lVar7 = 0;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      std::
      vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
      ::reserve((vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 *)(local_f8 + lVar7 * 0x18 + lVar6),(long)(int)uVar10);
      lVar7 = 1;
      bVar4 = false;
    } while (bVar13);
    bVar4 = false;
  } while (bVar11);
  local_98 = alloc->size_;
  pRVar8 = S2PaddedCell::middle(pcell);
  if (0 < (int)uVar10) {
    middle = pRVar8->bounds_ + 1;
    uVar12 = 0;
    do {
      pCVar9 = (edges->
               super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar12];
      child_edges_00 =
           (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            *)local_f8;
      if ((pCVar9->bound).bounds_[0].bounds_.c_[1] <= pRVar8->bounds_[0].bounds_.c_[0]) {
LAB_00192e66:
        ClipVAxis(pCVar9,middle,child_edges_00,alloc);
      }
      else {
        u = pRVar8->bounds_[0].bounds_.c_[1];
        child_edges_00 = &local_c8;
        if (u <= (pCVar9->bound).bounds_[0].bounds_.c_[0]) goto LAB_00192e66;
        if ((pCVar9->bound).bounds_[1].bounds_.c_[1] <= (middle->bounds_).c_[0]) {
          local_90.id_.id_ = (uint64)ClipUBound(pCVar9,1,u,alloc);
          if (local_f8._8_8_ == local_f8._16_8_) {
            std::
            vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
            ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                      ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                        *)local_f8,(iterator)local_f8._8_8_,(ClippedEdge **)&local_90);
          }
          else {
            *(uint64 *)local_f8._8_8_ = local_90.id_.id_;
            local_f8._8_8_ = local_f8._8_8_ + 8;
          }
          local_90.id_.id_ = (uint64)ClipUBound(pCVar9,0,pRVar8->bounds_[0].bounds_.c_[0],alloc);
          if (local_c8.
              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_c8.
              super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
            ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                      ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                        *)&local_c8,
                       (iterator)
                       local_c8.
                       super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(ClippedEdge **)&local_90);
          }
          else {
            *local_c8.
             super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = (ClippedEdge *)local_90.id_.id_;
            local_c8.
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_c8.
                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else if (pRVar8->bounds_[1].bounds_.c_[1] <= (pCVar9->bound).bounds_[1].bounds_.c_[0]) {
          local_90.id_.id_ = (uint64)ClipUBound(pCVar9,1,u,alloc);
          if (local_d8._M_current == ppCStack_d0) {
            std::
            vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
            ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                      ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                        *)&pMStack_e0,local_d8,(ClippedEdge **)&local_90);
          }
          else {
            *local_d8._M_current = (ClippedEdge *)local_90.id_.id_;
            local_d8._M_current = local_d8._M_current + 1;
          }
          local_90.id_.id_ = (uint64)ClipUBound(pCVar9,0,pRVar8->bounds_[0].bounds_.c_[0],alloc);
          if (local_a8._M_current == ppCStack_a0) {
            std::
            vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
            ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge_const*>
                      ((vector<MutableS2ShapeIndex::ClippedEdge_const*,std::allocator<MutableS2ShapeIndex::ClippedEdge_const*>>
                        *)&uStack_b0,local_a8,(ClippedEdge **)&local_90);
          }
          else {
            *local_a8._M_current = (ClippedEdge *)local_90.id_.id_;
            local_a8._M_current = local_a8._M_current + 1;
          }
        }
        else {
          edge = ClipUBound(pCVar9,1,u,alloc);
          ClipVAxis(edge,middle,
                    (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                     *)local_f8,alloc);
          pCVar9 = ClipUBound(pCVar9,0,pRVar8->bounds_[0].bounds_.c_[0],alloc);
          ClipVAxis(pCVar9,middle,&local_c8,alloc);
        }
      }
      uVar12 = uVar12 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar12);
  }
  lVar7 = 0;
  bVar4 = true;
  do {
    bVar11 = bVar4;
    lVar6 = lVar7 * 0x30;
    lVar7 = 0;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pvVar2 = *(void **)(local_f8 + lVar7 * 0x18 + lVar6);
      if (pvVar2 == *(void **)(local_f8 + lVar7 * 0x18 + lVar6 + 8)) {
        puVar1 = (undefined8 *)(local_f8 + lVar7 * 0x18 + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      lVar7 = 1;
      bVar4 = false;
    } while (bVar13);
    bVar4 = false;
  } while (bVar11);
  lVar7 = 0;
  do {
    i = (int)*(uint *)(S2::internal::kPosToIJ + lVar7 * 4 + (long)pcell->orientation_ * 0x10) >> 1;
    uVar10 = *(uint *)(S2::internal::kPosToIJ + lVar7 * 4 + (long)pcell->orientation_ * 0x10) & 1;
    uVar12 = (ulong)uVar10;
    lVar6 = (long)i * 0x30;
    if ((*(long *)(local_f8 + uVar12 * 0x18 + lVar6) !=
         *(long *)(local_f8 + uVar12 * 0x18 + lVar6 + 8)) ||
       ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      S2PaddedCell::S2PaddedCell(&local_90,pcell,i,uVar10);
      UpdateEdges(this,&local_90,
                  (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                   *)(local_f8 + uVar12 * 0x18 + lVar6),tracker,alloc,local_10c);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  alloc->size_ = local_98;
  lVar7 = 0x48;
  do {
    if (*(void **)(local_f8 + lVar7) != (void *)0x0) {
      operator_delete(*(void **)(local_f8 + lVar7));
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
joined_r0x00192cdc:
  if (bVar3) {
    InteriorTracker::RestoreStateBefore(tracker,this->pending_additions_begin_);
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::UpdateEdges(const S2PaddedCell& pcell,
                                      vector<const ClippedEdge*>* edges,
                                      InteriorTracker* tracker,
                                      EdgeAllocator* alloc,
                                      bool disjoint_from_index) {
  // Cases where an index cell is not needed should be detected before this.
  S2_DCHECK(!edges->empty() || !tracker->shape_ids().empty());

  // This function is recursive with a maximum recursion depth of 30
  // (S2CellId::kMaxLevel).  Note that using an explicit stack does not seem
  // to be any faster based on profiling.

  // Incremental updates are handled as follows.  All edges being added or
  // removed are combined together in "edges", and all shapes with interiors
  // are tracked using "tracker".  We subdivide recursively as usual until we
  // encounter an existing index cell.  At this point we "absorb" the index
  // cell as follows:
  //
  //   - Edges and shapes that are being removed are deleted from "edges" and
  //     "tracker".
  //   - All remaining edges and shapes from the index cell are added to
  //     "edges" and "tracker".
  //   - Continue subdividing recursively, creating new index cells as needed.
  //   - When the recursion gets back to the cell that was absorbed, we
  //     restore "edges" and "tracker" to their previous state.
  //
  // Note that the only reason that we include removed shapes in the recursive
  // subdivision process is so that we can find all of the index cells that
  // contain those shapes efficiently, without maintaining an explicit list of
  // index cells for each shape (which would be expensive in terms of memory).
  bool index_cell_absorbed = false;
  if (!disjoint_from_index) {
    // There may be existing index cells contained inside "pcell".  If we
    // encounter such a cell, we need to combine the edges being updated with
    // the existing cell contents by "absorbing" the cell.
    // Use InitStale() to avoid applying updated recursively.
    Iterator iter;
    iter.InitStale(this);
    CellRelation r = iter.Locate(pcell.id());
    if (r == DISJOINT) {
      disjoint_from_index = true;
    } else if (r == INDEXED) {
      // Absorb the index cell by transferring its contents to "edges" and
      // deleting it.  We also start tracking the interior of any new shapes.
      AbsorbIndexCell(pcell, iter, edges, tracker, alloc);
      index_cell_absorbed = true;
      disjoint_from_index = true;
    } else {
      S2_DCHECK_EQ(SUBDIVIDED, r);
    }
  }

  // If there are existing index cells below us, then we need to keep
  // subdividing so that we can merge with those cells.  Otherwise,
  // MakeIndexCell checks if the number of edges is small enough, and creates
  // an index cell if possible (returning true when it does so).
  if (!disjoint_from_index || !MakeIndexCell(pcell, *edges, tracker)) {
    // Reserve space for the edges that will be passed to each child.  This is
    // important since otherwise the running time is dominated by the time
    // required to grow the vectors.  The amount of memory involved is
    // relatively small, so we simply reserve the maximum space for every child.
    vector<const ClippedEdge*> child_edges[2][2];  // [i][j]
    int num_edges = edges->size();
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        child_edges[i][j].reserve(num_edges);
      }
    }

    // Remember the current size of the EdgeAllocator so that we can free any
    // edges that are allocated during edge splitting.
    size_t alloc_size = alloc->size();

    // Compute the middle of the padded cell, defined as the rectangle in
    // (u,v)-space that belongs to all four (padded) children.  By comparing
    // against the four boundaries of "middle" we can determine which children
    // each edge needs to be propagated to.
    const R2Rect& middle = pcell.middle();

    // Build up a vector edges to be passed to each child cell.  The (i,j)
    // directions are left (i=0), right (i=1), lower (j=0), and upper (j=1).
    // Note that the vast majority of edges are propagated to a single child.
    // This case is very fast, consisting of between 2 and 4 floating-point
    // comparisons and copying one pointer.  (ClipVAxis is inline.)
    for (int e = 0; e < num_edges; ++e) {
      const ClippedEdge* edge = (*edges)[e];
      if (edge->bound[0].hi() <= middle[0].lo()) {
        // Edge is entirely contained in the two left children.
        ClipVAxis(edge, middle[1], child_edges[0], alloc);
      } else if (edge->bound[0].lo() >= middle[0].hi()) {
        // Edge is entirely contained in the two right children.
        ClipVAxis(edge, middle[1], child_edges[1], alloc);
      } else if (edge->bound[1].hi() <= middle[1].lo()) {
        // Edge is entirely contained in the two lower children.
        child_edges[0][0].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][0].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else if (edge->bound[1].lo() >= middle[1].hi()) {
        // Edge is entirely contained in the two upper children.
        child_edges[0][1].push_back(ClipUBound(edge, 1, middle[0].hi(), alloc));
        child_edges[1][1].push_back(ClipUBound(edge, 0, middle[0].lo(), alloc));
      } else {
        // The edge bound spans all four children.  The edge itself intersects
        // either three or four (padded) children.
        const ClippedEdge* left = ClipUBound(edge, 1, middle[0].hi(), alloc);
        ClipVAxis(left, middle[1], child_edges[0], alloc);
        const ClippedEdge* right = ClipUBound(edge, 0, middle[0].lo(), alloc);
        ClipVAxis(right, middle[1], child_edges[1], alloc);
      }
    }
    // Free any memory reserved for children that turned out to be empty.  This
    // step is cheap and reduces peak memory usage by about 10% when building
    // large indexes (> 10M edges).
    for (int i = 0; i < 2; ++i) {
      for (int j = 0; j < 2; ++j) {
        if (child_edges[i][j].empty()) {
          vector<const ClippedEdge*>().swap(child_edges[i][j]);
        }
      }
    }
    // Now recursively update the edges in each child.  We call the children in
    // increasing order of S2CellId so that when the index is first constructed,
    // all insertions into cell_map_ are at the end (which is much faster).
    for (int pos = 0; pos < 4; ++pos) {
      int i, j;
      pcell.GetChildIJ(pos, &i, &j);
      if (!child_edges[i][j].empty() || !tracker->shape_ids().empty()) {
        UpdateEdges(S2PaddedCell(pcell, i, j), &child_edges[i][j],
                    tracker, alloc, disjoint_from_index);
      }
    }
    // Free any temporary edges that were allocated during clipping.
    alloc->Reset(alloc_size);
  }
  if (index_cell_absorbed) {
    // Restore the state for any edges being removed that we are tracking.
    tracker->RestoreStateBefore(pending_additions_begin_);
  }
}